

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t uVar4;
  ptls_key_schedule_t *ppVar5;
  ptls_context_t *ppVar6;
  size_t sVar7;
  _func_void_void_ptr_size_t *p_Var8;
  ptls_hpke_cipher_suite_t *ppVar9;
  size_t *psVar10;
  st_ptls_key_exchange_algorithm_t *psVar11;
  ptls_hash_algorithm_t *algo;
  ptls_hpke_kem_t *ppVar12;
  ptls_buffer_t *sendbuf;
  st_ptls_aead_context_t *psVar13;
  ptls_iovec_t info;
  ptls_iovec_t hash_value;
  ptls_iovec_t psk_secret;
  ptls_iovec_t psk_secret_00;
  ptls_iovec_t psk_secret_01;
  ptls_iovec_t psk_identity;
  ptls_iovec_t psk_identity_00;
  ptls_iovec_t psk_identity_01;
  ptls_iovec_t ikm;
  undefined8 uVar14;
  int iVar15;
  ptls_early_data_acceptance_t pVar16;
  int iVar17;
  uint32_t obfuscated_ticket_age;
  ptls_hpke_cipher_suite_t **pppVar18;
  ptls_aead_context_t *ppVar19;
  char *pcVar20;
  ptls_key_schedule_t *ppVar21;
  size_t sVar22;
  ptls_iovec_t *ppVar23;
  ptls_hpke_kem_t **pppVar24;
  ulong uVar25;
  char *__s;
  ptls_cipher_suite_t **pppVar26;
  uint8_t *puVar27;
  ptls_key_exchange_algorithm_t *ppVar28;
  ptls_hash_context_t **pppVar29;
  ptls_cipher_suite_t *ppVar30;
  long lVar31;
  ptls_key_exchange_algorithm_t **pppVar32;
  uint8_t *client_random;
  uint is_second_flight;
  size_t sVar33;
  size_t sVar34;
  size_t sVar35;
  uint8_t *puVar36;
  size_t sVar37;
  bool bVar38;
  ptls_iovec_t secret;
  ptls_iovec_t config_list;
  uint32_t max_early_data_size;
  uint32_t age_add;
  st_decoded_ech_config_t decoded;
  ptls_buffer_t infobuf;
  uint32_t lifetime;
  uint8_t binder_key [64];
  ptls_buffer_t local_258;
  uint8_t *local_238;
  size_t sStack_230;
  ptls_iovec_t local_228;
  char *local_218;
  uint local_210;
  uint32_t local_20c;
  size_t local_208;
  uint8_t *local_200;
  ptls_iovec_t *local_1f8;
  st_ptls_ech_t *local_1f0;
  st_decoded_ech_config_t local_1e8;
  ptls_buffer_t local_198;
  uint8_t *local_178;
  uint8_t *local_170;
  ptls_iovec_t *local_168;
  size_t sStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ptls_iovec_t local_138;
  undefined1 local_128 [248];
  
  local_228.base = (uint8_t *)0x0;
  local_228.len = 0;
  local_238 = (uint8_t *)0x0;
  sStack_230 = 0;
  local_218 = (char *)0x0;
  ppVar5 = tls->key_schedule;
  local_258.base = "";
  local_258.capacity = 0;
  local_258.off = 0;
  local_258._24_8_ = local_258._24_8_ & 0xffffffffffff0000;
  if ((tls->server_name == (char *)0x0) ||
     (iVar15 = ptls_server_name_is_ipaddr(tls->server_name), iVar15 != 0)) {
    __s = (char *)0x0;
  }
  else {
    __s = tls->server_name;
  }
  if ((__s != (char *)0x0 && properties != (ptls_handshake_properties_t *)0x0) &&
      ppVar5 == (ptls_key_schedule_t *)0x0) {
    ppVar6 = tls->ctx;
    pppVar18 = (ppVar6->ech).client.ciphers;
    if (pppVar18 != (ptls_hpke_cipher_suite_t **)0x0) {
      sVar7 = (properties->field_0).client.ech.configs.len;
      if (sVar7 == 0) {
        p_Var8 = ppVar6->random_bytes;
        pppVar24 = (ppVar6->ech).client.kems;
        ppVar12 = *pppVar24;
        while (ppVar12 != (ptls_hpke_kem_t *)0x0) {
          pppVar24 = pppVar24 + 1;
          if (ppVar12->id == 0x20) {
            (tls->ech).kem = ppVar12;
            break;
          }
          ppVar12 = *pppVar24;
        }
        ppVar9 = *pppVar18;
        while (ppVar9 != (ptls_hpke_cipher_suite_t *)0x0) {
          pppVar18 = pppVar18 + 1;
          if (((ppVar9->id).kdf == 1) && ((ppVar9->id).aead == 1)) {
            (tls->ech).cipher = ppVar9;
            break;
          }
          ppVar9 = *pppVar18;
        }
        if (((tls->ech).kem != (ptls_hpke_kem_t *)0x0) &&
           ((tls->ech).cipher != (ptls_hpke_cipher_suite_t *)0x0)) {
          (*p_Var8)(&local_138,0x20);
          ppVar19 = ptls_aead_new_direct(((tls->ech).cipher)->aead,1,&local_138,local_128);
          (tls->ech).aead = ppVar19;
          puVar36 = (uint8_t *)malloc(0x20);
          (tls->ech).client.enc.base = puVar36;
          if (puVar36 != (uint8_t *)0x0) {
            (tls->ech).client.enc.len = 0x20;
            (*p_Var8)(puVar36,0x20);
            (*p_Var8)(&(tls->ech).config_id,1);
            (tls->ech).client.max_name_length = '@';
            sVar37 = strlen(__s);
            pcVar20 = (char *)malloc(sVar37 + 1);
            if (pcVar20 == (char *)0x0) {
              pcVar20 = (char *)0x0;
            }
            else {
              memcpy(pcVar20,__s,sVar37);
              pcVar20[sVar37] = '\0';
            }
            (tls->ech).client.public_name = pcVar20;
            if (pcVar20 != (char *)0x0) goto LAB_001198e4;
          }
        }
        clear_ech(&tls->ech,0);
      }
      else {
        config_list.len = sVar7;
        config_list.base = (properties->field_0).client.ech.configs.base;
        client_decode_ech_config_list(ppVar6,&local_1e8,config_list);
        ppVar12 = local_1e8.kem;
        iVar15 = 0;
        bVar38 = true;
        if (local_1e8.cipher != (ptls_hpke_cipher_suite_t *)0x0 &&
            local_1e8.kem != (ptls_hpke_kem_t *)0x0) {
          p_Var8 = tls->ctx->random_bytes;
          local_198.base = (uint8_t *)&local_138;
          local_198.off = 0;
          local_198.capacity = 0x100;
          local_198.is_allocated = '\0';
          local_198.align_bits = '\0';
          iVar15 = ptls_buffer_reserve_aligned(&local_198,8,'\0');
          if (iVar15 == 0) {
            builtin_memcpy((uint8_t *)((long)(uint8_t **)local_198.base + local_198.off),"tls ech",8
                          );
            local_198.off = local_198.off + 8;
            iVar15 = 0;
          }
          if ((iVar15 == 0) &&
             (iVar15 = ptls_buffer__do_pushv(&local_198,local_1e8.bytes.base,local_1e8.bytes.len),
             iVar15 == 0)) {
            local_168 = (ptls_iovec_t *)local_198.base;
            sStack_160 = local_198.off;
            info.len = local_198.off;
            info.base = local_198.base;
            iVar15 = ptls_hpke_setup_base_s
                               (ppVar12,local_1e8.cipher,&(tls->ech).client.enc,&(tls->ech).aead,
                                local_1e8.public_key,info);
            if (iVar15 == 0) {
              (tls->ech).config_id = local_1e8.id;
              (tls->ech).kem = ppVar12;
              (tls->ech).cipher = local_1e8.cipher;
              (*p_Var8)((tls->ech).inner_client_random,0x20);
              (tls->ech).client.max_name_length = local_1e8.max_name_length;
              pcVar20 = (char *)malloc(local_1e8.public_name.len + 1);
              iVar15 = 0;
              if (pcVar20 == (char *)0x0) {
                pcVar20 = (char *)0x0;
              }
              else {
                memcpy(pcVar20,local_1e8.public_name.base,local_1e8.public_name.len);
                pcVar20[local_1e8.public_name.len] = '\0';
              }
              (tls->ech).client.public_name = pcVar20;
              if (pcVar20 == (char *)0x0) {
                iVar15 = 0x201;
              }
            }
          }
          if (iVar15 == 0) {
            iVar15 = 0;
          }
          else {
            bVar38 = false;
            clear_ech(&tls->ech,0);
          }
        }
        if (!bVar38) goto LAB_0011a01f;
      }
    }
  }
LAB_001198e4:
  ppVar6 = tls->ctx;
  if ((ppVar6->pre_shared_key).identity.base != (uint8_t *)0x0) {
    if (ppVar5 == (ptls_key_schedule_t *)0x0) {
      bVar1 = (tls->field_19).server.pending_traffic_secret[0x38];
      (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 1;
      pppVar26 = ppVar6->cipher_suites;
      ppVar30 = *pppVar26;
      if (ppVar30 != (ptls_cipher_suite_t *)0x0) {
        do {
          pppVar26 = pppVar26 + 1;
          if (ppVar30->hash == (ppVar6->pre_shared_key).hash) {
            tls->cipher_suite = ppVar30;
            break;
          }
          ppVar30 = *pppVar26;
        } while (ppVar30 != (ptls_cipher_suite_t *)0x0);
      }
      if (tls->cipher_suite == (ptls_cipher_suite_t *)0x0) {
        __assert_fail("tls->cipher_suite != NULL && \"no compatible cipher-suite provided that matches psk.hash\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x954,
                      "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                     );
      }
      if ((properties != (ptls_handshake_properties_t *)0x0) &&
         ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 3;
        *(properties->field_0).client.max_early_data_size = 0xffffffffffffffff;
      }
    }
    else if ((tls->cipher_suite == (ptls_cipher_suite_t *)0x0) ||
            (tls->cipher_suite->hash != (ppVar6->pre_shared_key).hash)) {
      __assert_fail("tls->cipher_suite != NULL && tls->cipher_suite->hash == tls->ctx->pre_shared_key.hash"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x95a,
                    "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                   );
    }
    local_238 = (ppVar6->pre_shared_key).secret.base;
    sStack_230 = (ppVar6->pre_shared_key).secret.len;
    local_228.base = (ppVar6->pre_shared_key).identity.base;
    local_228.len = (ppVar6->pre_shared_key).identity.len;
    local_218 = "ext binder";
  }
  obfuscated_ticket_age = 0;
  if ((((properties != (ptls_handshake_properties_t *)0x0) && (local_238 == (uint8_t *)0x0)) &&
      (puVar36 = (properties->field_0).client.session_ticket.base, puVar36 != (uint8_t *)0x0)) &&
     (obfuscated_ticket_age = 0, ppVar6->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) {
    puVar27 = puVar36 + *(long *)((long)&properties->field_0 + 0x18);
    local_1e8._0_8_ = puVar36;
    iVar15 = ptls_decode64((uint64_t *)&local_198,(uint8_t **)&local_1e8,puVar27);
    if (iVar15 == 0) {
      if ((long)puVar27 - local_1e8._0_8_ < 2) {
        iVar15 = 0x32;
        goto LAB_00119cca;
      }
      uVar2 = *(ushort *)local_1e8._0_8_;
      puVar36 = (uint8_t *)(local_1e8._0_8_ + 2);
      if ((long)puVar27 - (long)puVar36 < 2) {
        iVar15 = 0x32;
        local_1e8._0_8_ = puVar36;
        goto LAB_00119cca;
      }
      uVar3 = *(ushort *)puVar36;
      puVar36 = (uint8_t *)(local_1e8._0_8_ + 4);
      iVar15 = 0x32;
      if ((ulong)((long)puVar27 - (long)puVar36) < 3) {
        bVar38 = false;
      }
      else {
        lVar31 = 0;
        uVar25 = 0;
        do {
          uVar25 = (ulong)puVar36[lVar31] | uVar25 << 8;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 3);
        local_1e8._0_8_ = local_1e8._0_8_ + 7;
        if ((ulong)((long)puVar27 - local_1e8._0_8_) < uVar25) {
          bVar38 = false;
          puVar36 = (uint8_t *)local_1e8._0_8_;
        }
        else {
          puVar36 = (uint8_t *)(local_1e8._0_8_ + uVar25);
          iVar17 = decode_new_session_ticket
                             (tls,(uint32_t *)&local_168,&local_20c,&local_138,&local_228,&local_210
                              ,(uint8_t *)local_1e8._0_8_,puVar36);
          iVar15 = 0;
          bVar38 = iVar17 == 0;
          if (!bVar38) {
            iVar15 = iVar17;
            puVar36 = (uint8_t *)local_1e8._0_8_;
          }
        }
      }
      local_1e8._0_8_ = puVar36;
      if (!bVar38) goto LAB_00119cca;
      if ((ulong)((long)puVar27 - local_1e8._0_8_) < 2) {
LAB_00119c87:
        bVar38 = false;
        iVar17 = 0x32;
      }
      else {
        lVar31 = 0;
        uVar25 = 0;
        do {
          uVar25 = (ulong)*(uint8_t *)(local_1e8._0_8_ + lVar31) | uVar25 << 8;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 2);
        puVar36 = (uint8_t *)(local_1e8._0_8_ + 2);
        local_1e8._0_8_ = puVar36;
        if ((ulong)((long)puVar27 - (long)puVar36) < uVar25) goto LAB_00119c87;
        local_1e8._0_8_ = puVar36 + uVar25;
        bVar38 = true;
        iVar17 = iVar15;
        local_238 = puVar36;
        sStack_230 = uVar25;
      }
      if (bVar38) {
        iVar15 = 0x32;
        if ((uint8_t *)local_1e8._0_8_ != puVar27) goto LAB_00119cca;
        ppVar6 = tls->ctx;
        pppVar32 = ppVar6->key_exchanges;
        ppVar28 = *pppVar32;
        obfuscated_ticket_age = 0;
        bVar38 = ppVar28 == (ptls_key_exchange_algorithm_t *)0x0;
        if (bVar38) {
LAB_0011a5b0:
          ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
          bVar38 = false;
          iVar17 = 0x203;
        }
        else {
          uVar4 = ppVar28->id;
          while (uVar4 != (uint16_t)(uVar2 << 8 | uVar2 >> 8)) {
            pppVar32 = pppVar32 + 1;
            ppVar28 = *pppVar32;
            bVar38 = ppVar28 == (ptls_key_exchange_algorithm_t *)0x0;
            if (bVar38) goto LAB_0011a5b0;
            uVar4 = ppVar28->id;
          }
          if (bVar38) goto LAB_0011a5b0;
          bVar38 = true;
        }
        if (bVar38) {
          pppVar26 = ppVar6->cipher_suites;
          ppVar30 = *pppVar26;
          bVar38 = ppVar30 == (ptls_cipher_suite_t *)0x0;
          if (bVar38) {
LAB_0011a601:
            ppVar30 = (ptls_cipher_suite_t *)0x0;
            bVar38 = false;
            iVar17 = 0x203;
          }
          else {
            uVar4 = ppVar30->id;
            while (uVar4 != (uint16_t)(uVar3 << 8 | uVar3 >> 8)) {
              pppVar26 = pppVar26 + 1;
              ppVar30 = *pppVar26;
              bVar38 = ppVar30 == (ptls_cipher_suite_t *)0x0;
              if (bVar38) goto LAB_0011a601;
              uVar4 = ppVar30->id;
            }
            if (bVar38) goto LAB_0011a601;
            bVar38 = true;
          }
          if (!bVar38) goto LAB_0011a2d7;
          ppVar23 = (ptls_iovec_t *)(*ppVar6->get_time->cb)(ppVar6->get_time);
          if ((ppVar23 < local_198.base) ||
             (0x240c83ff < (ulong)((long)ppVar23 - (long)local_198.base))) {
            obfuscated_ticket_age = 0;
            iVar17 = 0x32;
          }
          else {
            obfuscated_ticket_age = (int)((long)ppVar23 - (long)local_198.base) + local_20c;
            iVar17 = 0;
          }
        }
        else {
          ppVar30 = (ptls_cipher_suite_t *)0x0;
        }
      }
      else {
        ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
        ppVar30 = (ptls_cipher_suite_t *)0x0;
LAB_0011a2d7:
        obfuscated_ticket_age = 0;
      }
    }
    else {
LAB_00119cca:
      obfuscated_ticket_age = 0;
      ppVar28 = (ptls_key_exchange_algorithm_t *)0x0;
      ppVar30 = (ptls_cipher_suite_t *)0x0;
      iVar17 = iVar15;
    }
    if (iVar17 == 0) {
      local_218 = "res binder";
      bVar1 = (tls->field_19).server.pending_traffic_secret[0x38];
      (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 1;
      if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
        tls->key_share = ppVar28;
      }
      tls->cipher_suite = ppVar30;
      if ((local_210 != 0 && ppVar5 == (ptls_key_schedule_t *)0x0) &&
         ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 3;
        *(properties->field_0).client.max_early_data_size = (ulong)local_210;
      }
    }
    else {
      local_238 = (uint8_t *)0x0;
      sStack_230 = 0;
    }
  }
  if (properties != (ptls_handshake_properties_t *)0x0) {
    pVar16 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
    if (((tls->field_19).server.pending_traffic_secret[0x38] & 2) == 0) {
      psVar10 = (properties->field_0).client.max_early_data_size;
      pVar16 = PTLS_EARLY_DATA_REJECTED;
      if (psVar10 != (size_t *)0x0) {
        *psVar10 = 0;
      }
    }
    (properties->field_0).client.early_data_acceptance = pVar16;
  }
  if (((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
      (pppVar32 = tls->ctx->key_exchanges, pppVar32 != (ptls_key_exchange_algorithm_t **)0x0)) &&
     ((properties == (ptls_handshake_properties_t *)0x0 ||
      (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)))) {
    tls->key_share = *pppVar32;
  }
  if ((tls->field_19).client.key_share_ctx != (ptls_key_exchange_context_t *)0x0) {
    __assert_fail("tls->client.key_share_ctx == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x98a,
                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                 );
  }
  psVar11 = tls->key_share;
  if ((psVar11 != (st_ptls_key_exchange_algorithm_t *)0x0) &&
     (iVar15 = (*psVar11->create)(psVar11,&(tls->field_19).client.key_share_ctx), iVar15 != 0))
  goto LAB_0011a01f;
  if (ppVar5 == (ptls_key_schedule_t *)0x0) {
    ppVar21 = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                               (uint)((tls->ech).aead != (ptls_aead_context_t *)0x0));
    tls->key_schedule = ppVar21;
    if (ppVar21 == (ptls_key_schedule_t *)0x0) {
      iVar15 = 0x201;
      goto LAB_0011a01f;
    }
    ikm.len = sStack_230;
    ikm.base = local_238;
    iVar15 = key_schedule_extract(ppVar21,ikm);
    if (iVar15 != 0) goto LAB_0011a01f;
  }
  iVar15 = (*emitter->begin_message)(emitter);
  if (iVar15 != 0) goto LAB_0011a01f;
  local_1f8 = (ptls_iovec_t *)&tls->field_19;
  sVar7 = emitter->buf->off;
  local_1f0 = &tls->ech;
  puVar36 = (tls->ech).inner_client_random;
  puVar27 = tls->client_random;
  client_random = puVar36;
  if ((tls->ech).aead == (ptls_aead_context_t *)0x0) {
    client_random = puVar27;
  }
  is_second_flight = (uint)(ppVar5 != (ptls_key_schedule_t *)0x0);
  psk_secret.len = sStack_230;
  psk_secret.base = local_238;
  psk_identity.len = local_228.len;
  psk_identity.base = local_228.base;
  iVar15 = encode_client_hello(tls->ctx,emitter->buf,ENCODE_CH_MODE_INNER,is_second_flight,
                               properties,client_random,(tls->field_19).client.key_share_ctx,__s,
                               ((anon_struct_120_6_b99d20b8_for_client *)local_1f8)->
                               legacy_session_id,local_1f0,(size_t *)0x0,(tls->ech).client.first_ech
                               ,psk_secret,psk_identity,obfuscated_ticket_age,
                               (tls->key_schedule->hashes[0].algo)->digest_size,cookie,
                               *(uint *)((long)&tls->field_19 + 0x38) >> 1 & 1);
  if (iVar15 != 0) goto LAB_0011a01f;
  local_200 = local_238;
  sVar33 = sVar7;
  local_178 = puVar27;
  local_170 = puVar36;
  if (local_238 != (uint8_t *)0x0) {
    sVar35 = emitter->buf->off;
    algo = tls->key_schedule->hashes[0].algo;
    ppVar12 = (ptls_hpke_kem_t *)algo->digest_size;
    local_1e8._0_8_ = algo->empty_digest;
    secret.base = tls->key_schedule->secret;
    hash_value.len = (size_t)ppVar12;
    hash_value.base = (uint8_t *)local_1e8._0_8_;
    secret.len = (size_t)ppVar12;
    local_1e8.kem = ppVar12;
    iVar15 = ptls_hkdf_expand_label
                       (algo,&local_138,(size_t)ppVar12,secret,local_218,hash_value,(char *)0x0);
    if (iVar15 == 0) {
      local_208 = (sVar35 - (long)ppVar12) - 3;
      ppVar21 = tls->key_schedule;
      if (ppVar21->num_hashes != 0) {
        puVar36 = emitter->buf->base;
        sVar35 = local_208 - sVar7;
        pppVar29 = &ppVar21->hashes[0].ctx;
        sVar33 = 0;
        do {
          (*(*pppVar29)->update)(*pppVar29,puVar36 + sVar7,sVar35);
          sVar33 = sVar33 + 1;
          pppVar29 = pppVar29 + 3;
        } while (sVar33 != ppVar21->num_hashes);
      }
      sVar33 = local_208;
      iVar15 = calc_verify_data(emitter->buf->base + local_208 + 3,tls->key_schedule,&local_138);
      bVar38 = iVar15 == 0;
    }
    else {
      bVar38 = false;
    }
    if (!bVar38) goto LAB_0011a01f;
  }
  ppVar21 = tls->key_schedule;
  if (ppVar21->num_hashes != 0) {
    puVar36 = emitter->buf->base;
    sVar35 = emitter->buf->off;
    pppVar29 = &ppVar21->hashes[0].ctx;
    sVar34 = 0;
    do {
      (*(*pppVar29)->update)(*pppVar29,puVar36 + sVar33,sVar35 - sVar33);
      sVar34 = sVar34 + 1;
      pppVar29 = pppVar29 + 3;
    } while (sVar34 != ppVar21->num_hashes);
  }
  if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
    local_148 = 0;
    uStack_140 = 0;
    psk_secret_00.len = sStack_230;
    psk_secret_00.base = local_238;
    psk_identity_00.len = local_228.len;
    psk_identity_00.base = local_228.base;
    iVar15 = encode_client_hello(tls->ctx,&local_258,ENCODE_CH_MODE_ENCODED_INNER,is_second_flight,
                                 properties,local_170,(tls->field_19).client.key_share_ctx,__s,
                                 *local_1f8,local_1f0,(size_t *)0x0,(ptls_iovec_t)ZEXT816(0),
                                 psk_secret_00,psk_identity_00,obfuscated_ticket_age,
                                 (tls->key_schedule->hashes[0].algo)->digest_size,cookie,
                                 *(uint *)((long)&tls->field_19 + 0x38) >> 1 & 1);
    if (iVar15 != 0) goto LAB_0011a01f;
    if (local_200 != (uint8_t *)0x0) {
      sVar37 = (tls->key_schedule->hashes[0].algo)->digest_size;
      memcpy(local_258.base + (local_258.off - sVar37),
             emitter->buf->base + (emitter->buf->off - sVar37),sVar37);
    }
    if (__s == (char *)0x0) {
      sVar37 = (ulong)(tls->ech).client.max_name_length + 9;
    }
    else {
      sVar22 = strlen(__s);
      sVar37 = (size_t)(tls->ech).client.max_name_length;
      if (sVar37 < sVar22) {
        sVar37 = sVar22;
      }
    }
    bVar38 = true;
    sVar37 = (sVar37 + local_258.off + 0x1b & 0xffffffffffffffe0) - (local_258.off - 4);
    iVar15 = 0;
    if (sVar37 != 0) {
      iVar15 = 0;
      iVar17 = ptls_buffer_reserve_aligned(&local_258,sVar37,'\0');
      if (iVar17 == 0) {
        memset(local_258.base + local_258.off,0,sVar37);
        local_258.off = local_258.off + sVar37;
      }
      else {
        bVar38 = false;
        iVar15 = iVar17;
      }
    }
    if (!bVar38) goto LAB_0011a01f;
    sendbuf = emitter->buf;
    sendbuf->off = sVar7;
    puVar36 = (uint8_t *)((local_258.off - 4) + ((tls->ech).aead)->algo->tag_size);
    local_158 = 0;
    uStack_150 = 0;
    psk_secret_01.len = sStack_230;
    psk_secret_01.base = local_238;
    psk_identity_01.len = local_228.len;
    psk_identity_01.base = local_228.base;
    local_1e8._0_8_ = puVar36;
    iVar15 = encode_client_hello(tls->ctx,sendbuf,ENCODE_CH_MODE_OUTER,is_second_flight,properties,
                                 local_178,(tls->field_19).client.key_share_ctx,
                                 (tls->ech).client.public_name,*local_1f8,local_1f0,
                                 (size_t *)&local_1e8,(ptls_iovec_t)ZEXT816(0),psk_secret_01,
                                 psk_identity_01,obfuscated_ticket_age,
                                 (tls->key_schedule->hashes[0].algo)->digest_size,cookie,
                                 *(uint *)((long)&tls->field_19 + 0x38) >> 1 & 1);
    uVar14 = local_1e8._0_8_;
    bVar38 = true;
    if (iVar15 == 0) {
      psVar13 = (tls->ech).aead;
      puVar27 = emitter->buf->base;
      (*psVar13->do_encrypt)
                (psVar13,(uint8_t *)(local_1e8._0_8_ + (long)puVar27),local_258.base + 4,
                 local_258.off - 4,(ulong)(ppVar5 != (ptls_key_schedule_t *)0x0),puVar27 + sVar7 + 4
                 ,(emitter->buf->off - sVar7) - 4,(ptls_aead_supplementary_encryption_t *)0x0);
      if (ppVar5 == (ptls_key_schedule_t *)0x0) {
        sVar33 = (tls->ech).client.enc.len;
        puVar36 = puVar36 + sVar33 + 10;
        puVar27 = (uint8_t *)malloc((size_t)puVar36);
        (tls->ech).client.first_ech.base = puVar27;
        bVar38 = puVar27 == (uint8_t *)0x0;
        if (bVar38) {
          iVar15 = 0x201;
          goto LAB_0011a69c;
        }
        memcpy(puVar27,(uint8_t *)(uVar14 + (long)(emitter->buf->base + (-10 - sVar33))),
               (size_t)puVar36);
        (tls->ech).client.first_ech.len = (size_t)puVar36;
        *(byte *)&tls->ech =
             *(byte *)&tls->ech | ((properties->field_0).client.ech.configs.len == 0) + 1U;
      }
      iVar15 = 0;
      ppVar21 = tls->key_schedule;
      if (ppVar21->num_hashes != 0) {
        puVar36 = emitter->buf->base;
        sVar33 = emitter->buf->off;
        pppVar29 = &ppVar21->hashes[0].ctx_outer;
        sVar35 = 0;
        do {
          (*(*pppVar29)->update)(*pppVar29,puVar36 + sVar7,sVar33 - sVar7);
          sVar35 = sVar35 + 1;
          pppVar29 = pppVar29 + 3;
        } while (sVar35 != ppVar21->num_hashes);
      }
      bVar38 = false;
    }
LAB_0011a69c:
    if (bVar38) goto LAB_0011a01f;
    if (bVar38) {
      return iVar15;
    }
  }
  iVar15 = (*emitter->commit_message)(emitter);
  if (iVar15 == 0) {
    if (((tls->field_19).server.pending_traffic_secret[0x38] & 2) != 0) {
      if (ppVar5 != (ptls_key_schedule_t *)0x0) {
        __assert_fail("!is_second_flight",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x9fb,
                      "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                     );
      }
      iVar15 = setup_traffic_protection(tls,1,"c e traffic",1,0,0);
      if ((iVar15 != 0) || (iVar15 = push_change_cipher_spec(tls,emitter), iVar15 != 0))
      goto LAB_0011a01f;
    }
    if ((ppVar5 != (ptls_key_schedule_t *)0x0 || local_200 == (uint8_t *)0x0) ||
       (iVar15 = derive_exporter_secret(tls,1), iVar15 == 0)) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO - (cookie == (ptls_iovec_t *)0x0);
      iVar15 = 0x202;
    }
  }
LAB_0011a01f:
  (*ptls_clear_memory)(local_258.base,local_258.off);
  if (local_258.is_allocated != '\0') {
    free(local_258.base);
  }
  local_258.off = 0;
  local_258.is_allocated = '\0';
  local_258.align_bits = '\0';
  local_258._26_6_ = 0;
  local_258.base = (uint8_t *)0x0;
  local_258.capacity = 0;
  (*ptls_clear_memory)(&local_138,0x40);
  return iVar15;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    struct {
        ptls_iovec_t secret;
        ptls_iovec_t identity;
        const char *label;
    } psk = {{NULL}};
    uint32_t obfuscated_ticket_age = 0;
    const char *sni_name = NULL;
    size_t mess_start, msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    ptls_buffer_t encoded_ch_inner;
    int ret, is_second_flight = tls->key_schedule != NULL;

    ptls_buffer_init(&encoded_ch_inner, "", 0);

    if (tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name))
        sni_name = tls->server_name;

    /* try to use ECH (ignore broken ECHConfigList; it is delivered insecurely) */
    if (properties != NULL) {
        if (!is_second_flight && sni_name != NULL && tls->ctx->ech.client.ciphers != NULL) {
            if (properties->client.ech.configs.len != 0) {
                struct st_decoded_ech_config_t decoded;
                client_decode_ech_config_list(tls->ctx, &decoded, properties->client.ech.configs);
                if (decoded.kem != NULL && decoded.cipher != NULL) {
                    if ((ret = client_setup_ech(&tls->ech, &decoded, tls->ctx->random_bytes)) != 0)
                        goto Exit;
                }
            } else {
                /* zero-length config indicates ECH greasing */
                client_setup_ech_grease(&tls->ech, tls->ctx->random_bytes, tls->ctx->ech.client.kems, tls->ctx->ech.client.ciphers,
                                        sni_name);
            }
        }
    }

    /* use external PSK if provided */
    if (tls->ctx->pre_shared_key.identity.base != NULL) {
        if (!is_second_flight) {
            tls->client.offered_psk = 1;
            for (size_t i = 0; tls->ctx->cipher_suites[i] != NULL; ++i) {
                if (tls->ctx->cipher_suites[i]->hash == tls->ctx->pre_shared_key.hash) {
                    tls->cipher_suite = tls->ctx->cipher_suites[i];
                    break;
                }
            }
            assert(tls->cipher_suite != NULL && "no compatible cipher-suite provided that matches psk.hash");
            if (properties != NULL && properties->client.max_early_data_size != NULL) {
                tls->client.using_early_data = 1;
                *properties->client.max_early_data_size = SIZE_MAX;
            }
        } else {
            assert(tls->cipher_suite != NULL && tls->cipher_suite->hash == tls->ctx->pre_shared_key.hash);
        }
        psk.secret = tls->ctx->pre_shared_key.secret;
        psk.identity = tls->ctx->pre_shared_key.identity;
        psk.label = "ext binder";
    }

    /* try to setup resumption-related data, unless external PSK is used */
    if (psk.secret.base == NULL && properties != NULL && properties->client.session_ticket.base != NULL &&
        tls->ctx->key_exchanges != NULL) {
        ptls_key_exchange_algorithm_t *key_share = NULL;
        ptls_cipher_suite_t *cipher_suite = NULL;
        uint32_t max_early_data_size;
        if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &psk.secret, &obfuscated_ticket_age, &psk.identity,
                                         &max_early_data_size, properties->client.session_ticket.base,
                                         properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
            psk.label = "res binder";
            tls->client.offered_psk = 1;
            /* key-share selected by HRR should not be overridden */
            if (tls->key_share == NULL)
                tls->key_share = key_share;
            tls->cipher_suite = cipher_suite;
            if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                tls->client.using_early_data = 1;
                *properties->client.max_early_data_size = max_early_data_size;
            }
        } else {
            psk.secret = ptls_iovec_init(NULL, 0);
        }
    }

    /* send 0-RTT related signals back to the client */
    if (properties != NULL) {
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && tls->ctx->key_exchanges != NULL &&
        !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    /* instantiate key share context */
    assert(tls->client.key_share_ctx == NULL);
    if (tls->key_share != NULL) {
        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
            goto Exit;
    }

    /* initialize key schedule */
    if (!is_second_flight) {
        if ((tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ech.aead != NULL)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if ((ret = key_schedule_extract(tls->key_schedule, psk.secret)) != 0)
            goto Exit;
    }

    /* start generating CH */
    if ((ret = emitter->begin_message(emitter)) != 0)
        goto Exit;
    mess_start = msghash_off = emitter->buf->off;

    /* generate true (inner) CH */
    if ((ret = encode_client_hello(tls->ctx, emitter->buf, ENCODE_CH_MODE_INNER, is_second_flight, properties,
                                   tls->ech.aead != NULL ? tls->ech.inner_client_random : tls->client_random,
                                   tls->client.key_share_ctx, sni_name, tls->client.legacy_session_id, &tls->ech, NULL,
                                   tls->ech.client.first_ech, psk.secret, psk.identity, obfuscated_ticket_age,
                                   tls->key_schedule->hashes[0].algo->digest_size, cookie, tls->client.using_early_data)) != 0)
        goto Exit;

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (psk.secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, psk.label)) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off, 0);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off, 0);

    /* ECH */
    if (tls->ech.aead != NULL) {
        /* build EncodedCHInner */
        if ((ret = encode_client_hello(tls->ctx, &encoded_ch_inner, ENCODE_CH_MODE_ENCODED_INNER, is_second_flight, properties,
                                       tls->ech.inner_client_random, tls->client.key_share_ctx, sni_name,
                                       tls->client.legacy_session_id, &tls->ech, NULL, ptls_iovec_init(NULL, 0), psk.secret,
                                       psk.identity, obfuscated_ticket_age, tls->key_schedule->hashes[0].algo->digest_size, cookie,
                                       tls->client.using_early_data)) != 0)
            goto Exit;
        if (psk.secret.base != NULL)
            memcpy(encoded_ch_inner.base + encoded_ch_inner.off - tls->key_schedule->hashes[0].algo->digest_size,
                   emitter->buf->base + emitter->buf->off - tls->key_schedule->hashes[0].algo->digest_size,
                   tls->key_schedule->hashes[0].algo->digest_size);
        { /* pad EncodedCHInner (following draft-ietf-tls-esni-15 6.1.3) */
            size_t padding_len;
            if (sni_name != NULL) {
                padding_len = strlen(sni_name);
                if (padding_len < tls->ech.client.max_name_length)
                    padding_len = tls->ech.client.max_name_length;
            } else {
                padding_len = tls->ech.client.max_name_length + 9;
            }
            size_t final_len = encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE + padding_len;
            final_len = (final_len + 31) / 32 * 32;
            padding_len = final_len - (encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE);
            if (padding_len != 0) {
                if ((ret = ptls_buffer_reserve(&encoded_ch_inner, padding_len)) != 0)
                    goto Exit;
                memset(encoded_ch_inner.base + encoded_ch_inner.off, 0, padding_len);
                encoded_ch_inner.off += padding_len;
            }
        }
        /* flush CHInner, build CHOuterAAD */
        emitter->buf->off = mess_start;
        size_t ech_payload_size = encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE + tls->ech.aead->algo->tag_size,
               ech_size_offset = ech_payload_size;
        if ((ret = encode_client_hello(tls->ctx, emitter->buf, ENCODE_CH_MODE_OUTER, is_second_flight, properties,
                                       tls->client_random, tls->client.key_share_ctx, tls->ech.client.public_name,
                                       tls->client.legacy_session_id, &tls->ech, &ech_size_offset, ptls_iovec_init(NULL, 0),
                                       psk.secret, psk.identity, obfuscated_ticket_age,
                                       tls->key_schedule->hashes[0].algo->digest_size, cookie, tls->client.using_early_data)) != 0)
            goto Exit;
        /* overwrite ECH payload */
        ptls_aead_encrypt(tls->ech.aead, emitter->buf->base + ech_size_offset, encoded_ch_inner.base + PTLS_HANDSHAKE_HEADER_SIZE,
                          encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE, is_second_flight,
                          emitter->buf->base + mess_start + PTLS_HANDSHAKE_HEADER_SIZE,
                          emitter->buf->off - (mess_start + PTLS_HANDSHAKE_HEADER_SIZE));
        /* keep the copy of the 1st ECH extension so that we can send it again in 2nd CH in response to rejection with HRR */
        if (!is_second_flight) {
            size_t len = outer_ech_header_size(tls->ech.client.enc.len) + ech_payload_size;
            if ((tls->ech.client.first_ech.base = malloc(len)) == NULL) {
                ret = PTLS_ERROR_NO_MEMORY;
                goto Exit;
            }
            memcpy(tls->ech.client.first_ech.base,
                   emitter->buf->base + ech_size_offset - outer_ech_header_size(tls->ech.client.enc.len), len);
            tls->ech.client.first_ech.len = len;
            if (properties->client.ech.configs.len != 0) {
                tls->ech.offered = 1;
            } else {
                tls->ech.offered_grease = 1;
            }
        }
        /* update hash */
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + mess_start, emitter->buf->off - mess_start, 1);
    }

    /* commit CH to the record layer */
    if ((ret = emitter->commit_message(emitter)) != 0)
        goto Exit;

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (psk.secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    ptls_buffer_dispose(&encoded_ch_inner);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}